

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_cmp_key_str_test(void)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auStackY_168 [8];
  btree_kv_ops *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  key_len_t in_stack_fffffffffffffeae;
  void **vv;
  code *local_c8;
  int local_a4;
  undefined8 uStack_a0;
  int i;
  void *tmp;
  void **key_ptrs;
  char *pcStack_88;
  int n;
  char *keys [4];
  int cmp;
  btree_kv_ops *kv_ops;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  vv = (void **)0x105a45;
  memleak_start();
  keys[1] = "longstring";
  keys[2] = "longstringsuffix";
  pcStack_88 = "string";
  keys[0] = "srting";
  key_ptrs._4_4_ = 4;
  tmp = auStackY_168;
  uStack_a0 = 0;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffea0);
  for (local_a4 = 0; local_a4 < key_ptrs._4_4_; local_a4 = local_a4 + 1) {
    strlen(keys[(long)local_a4 + -1]);
    construct_key_ptr((char *)vv,in_stack_fffffffffffffeae,in_stack_fffffffffffffea0);
  }
  keys[3]._4_4_ = (*local_c8)(tmp,tmp,0);
  if (keys[3]._4_4_ != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4bf);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4bf,"void kv_cmp_key_str_test()");
    }
  }
  keys[3]._4_4_ = (*local_c8)(tmp,(long)tmp + 8,0);
  if (keys[3]._4_4_ < 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4c3);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ < 1) {
      __assert_fail("cmp > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4c3,"void kv_cmp_key_str_test()");
    }
  }
  iVar1 = (*local_c8)((long)tmp + 0x10,(long)tmp + 0x18,0);
  keys[3]._4_4_ = iVar1;
  sVar2 = strlen(keys[1]);
  sVar3 = strlen(keys[2]);
  if (iVar1 != (int)sVar2 - (int)sVar3) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4c7);
    iVar1 = keys[3]._4_4_;
    kv_cmp_key_str_test::__test_pass = 0;
    sVar2 = strlen(keys[1]);
    sVar3 = strlen(keys[2]);
    if (iVar1 != (int)sVar2 - (int)sVar3) {
      __assert_fail("cmp == ((int)strlen(keys[2]) - (int)strlen(keys[3]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4c7,"void kv_cmp_key_str_test()");
    }
  }
  keys[3]._4_4_ = (*local_c8)(tmp,(long)tmp + 0x18,0);
  if (keys[3]._4_4_ < 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4cb);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ < 1) {
      __assert_fail("cmp > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4cb,"void kv_cmp_key_str_test()");
    }
  }
  keys[3]._4_4_ = (*local_c8)(&stack0xffffffffffffff60,tmp,0);
  if (keys[3]._4_4_ != -1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4cf);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ != -1) {
      __assert_fail("cmp == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4cf,"void kv_cmp_key_str_test()");
    }
  }
  keys[3]._4_4_ = (*local_c8)(tmp,&stack0xffffffffffffff60,0);
  if (keys[3]._4_4_ != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4d3);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ != 1) {
      __assert_fail("cmp == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4d3,"void kv_cmp_key_str_test()");
    }
  }
  keys[3]._4_4_ = (*local_c8)(&stack0xffffffffffffff60,&stack0xffffffffffffff60,0);
  if (keys[3]._4_4_ != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4d7);
    kv_cmp_key_str_test::__test_pass = 0;
    if (keys[3]._4_4_ != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x4d7,"void kv_cmp_key_str_test()");
    }
  }
  freevars(vv,CONCAT26(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8));
  memleak_end();
  if (kv_cmp_key_str_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_cmp_key_str_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_cmp_key_str_test");
  }
  return;
}

Assistant:

void kv_cmp_key_str_test()
{

    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    int cmp;
    const char *keys[] = {"string",
                          "srting",
                          "longstring",
                          "longstringsuffix"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);
    void *tmp = NULL;


    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // construct key_ptrs
    for (int i = 0; i < n; i++){
        // omit null terminator
        construct_key_ptr(keys[i], strlen(keys[i]), &key_ptrs[i]);
    }


    // compare strings equal length equal values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[1], NULL);
    TEST_CHK( cmp > 0 );

    // compare strings diff length equal substrings
    cmp = kv_ops->cmp(&key_ptrs[2], &key_ptrs[3], NULL);
    TEST_CHK(cmp == ((int)strlen(keys[2]) - (int)strlen(keys[3])) );

    // compare strings diff length diff substrings
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[3], NULL);
    TEST_CHK( cmp > 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, &key_ptrs[0], NULL);
    TEST_CHK( cmp == -1 );

    // key2 is NULL
    cmp = kv_ops->cmp(&key_ptrs[0], &tmp, NULL);
    TEST_CHK( cmp == 1 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}